

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::ComputeRequiredData
          (TPZCompElWithMem<TPZInterfaceElement> *this,TPZMaterialDataT<double> *data,
          TPZVec<double> *qsi)

{
  int64_t iVar1;
  TPZMaterialData *in_RDX;
  TPZCompElWithMem<TPZInterfaceElement> *in_RSI;
  TPZInterfaceElement *in_RDI;
  TPZMaterialDataT<double> *in_stack_ffffffffffffffd8;
  
  TPZInterfaceElement::ComputeRequiredData
            (in_RDI,in_stack_ffffffffffffffd8,(TPZVec<double> *)0x1ae26fc);
  iVar1 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 1));
  if (iVar1 != 0) {
    iVar1 = GetGlobalIntegrationPointIndex(in_RSI,in_RDX);
    *(int *)((long)in_RSI[0xf].fIntPtIndices.super_TPZManVector<long,_128>.fExtAlloc + 0x2c4) =
         (int)iVar1;
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ComputeRequiredData(TPZMaterialDataT<STATE> &data,
                                                         TPZVec<REAL> &qsi){
    TBASE::ComputeRequiredData(data, qsi);
    if(fIntPtIndices.size())
    {
        data.intGlobPtIndex = GetGlobalIntegrationPointIndex(data);
    }
    //material index for the n-th CompEl integration point
}